

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::SmallVector<wasm::Expression_**,_4UL>::push_back
          (SmallVector<wasm::Expression_**,_4UL> *this,Expression ***x)

{
  ulong uVar1;
  Expression **ppEVar2;
  
  uVar1 = this->usedFixed;
  if (uVar1 < 4) {
    ppEVar2 = *x;
    this->usedFixed = uVar1 + 1;
    (this->fixed)._M_elems[uVar1] = ppEVar2;
    return;
  }
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
            (&this->flexible,x);
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }